

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_70d49::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  PixelType t;
  int iVar1;
  int iVar2;
  pointer pbVar3;
  long lVar4;
  Box2i *pBVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  pointer pbVar10;
  undefined1 in_R10B;
  ulong uVar11;
  long lVar12;
  Box<Imath_2_5::Vec2<int>_> local_98;
  FrameBuffer *local_88;
  Box2i *local_80;
  pointer local_78;
  undefined1 local_70 [8];
  Slice local_68;
  
  pbVar10 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = framebuf;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size((Box<Imath_2_5::Vec2<int>_> *)(local_70 + 8));
  local_80 = dw;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size(&local_98);
  local_98.max = (Vec2<int>)data;
  std::vector<float,_std::allocator<float>_>::resize
            (data,((long)local_98.min.y + 1) * ((long)(int)local_68.type + 1) *
                  ((long)pbVar10 - (long)pbVar3 >> 5));
  pBVar5 = local_80;
  lVar9 = 0;
  lVar12 = 0;
  uVar11 = 0;
  do {
    pbVar10 = (this->_channels).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5) <= uVar11) {
      return;
    }
    if (dontbotherloadingdepth) {
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar10->_M_dataplus)._M_p + lVar9),"Z");
      if ((bVar6) &&
         (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((this->_channels).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar9),"ZBack"), bVar6)) {
        pbVar10 = (this->_channels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00126f5e;
      }
    }
    else {
LAB_00126f5e:
      local_78 = (&pbVar10->_M_dataplus)[lVar12]._M_p;
      t = this->_type;
      lVar4 = *(long *)local_98.max;
      iVar1 = (pBVar5->min).x;
      iVar2 = (pBVar5->min).y;
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size(&local_98);
      iVar7 = local_98.min.x + 1;
      lVar8 = (long)(this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size((Box<Imath_2_5::Vec2<int>_> *)local_70);
      Imf_2_5::Slice::Slice
                ((Slice *)(local_70 + 8),t,
                 (char *)(lVar4 + (lVar8 >> 5) * (long)(iVar7 * iVar2 + iVar1) * -4 + lVar12),
                 lVar8 >> 3,
                 ((long)(this->_channels).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_channels).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) *
                 ((long)(int)local_70._0_4_ + 1) * 4,1,1,0.0,(bool)in_R10B,
                 SUB81((long)(int)local_70._0_4_ + 1,0));
      Imf_2_5::FrameBuffer::insert(local_88,local_78,(Slice *)(local_70 + 8));
    }
    uVar11 = uVar11 + 1;
    lVar12 = lVar12 + 4;
    lVar9 = lVar9 + 0x20;
  } while( true );
}

Assistant:

void 
    setUpFrameBuffer(vector<T> & data,FrameBuffer & framebuf,const Box2i & dw,bool dontbotherloadingdepth) const
    {
        
        // allocate enough space for all channels (even the depth channel)
        data.resize(_channels.size()*(dw.size().x+1)*(dw.size().y+1));
        for(size_t i=0;i<_channels.size();i++)
        {
            if(!dontbotherloadingdepth || (_channels[i]!="Z" && _channels[i]!="ZBack") )
            {
                framebuf.insert(_channels[i].c_str(),
                                Slice(_type,(char *) (&data[i] - (dw.min.x + dw.min.y*(dw.size().x+1))*_channels.size() ),
                                      sizeof(T)*_channels.size(),
                                      sizeof(T)*(dw.size().x+1)*_channels.size())
                                      );
            }
        }
    }